

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined1 *this_01;
  cmMakefile *pcVar1;
  CURL *curl_00;
  bool bVar2;
  size_type sVar3;
  reference pbVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  ostream *poVar8;
  reference pcVar9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_6e8;
  value_type_conflict local_6d9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_6d8;
  value_type_conflict local_6c9;
  string local_6c8 [8];
  string log;
  ostringstream local_688 [8];
  ostringstream result;
  allocator local_509;
  undefined1 local_508 [8];
  string e_14;
  undefined1 local_4e0 [8];
  string e_13;
  undefined1 local_4b8 [8];
  string e_12;
  undefined1 local_490 [8];
  string e_11;
  undefined1 local_468 [8];
  string e_10;
  cURLProgressHelper helper;
  undefined1 local_410 [8];
  string e_9;
  undefined1 local_3e8 [8];
  string e_8;
  undefined1 local_3c0 [8];
  string e_7;
  undefined1 local_398 [8];
  string e_6;
  undefined1 local_370 [8];
  string e_5;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  undefined1 local_318 [8];
  string e_4;
  undefined1 local_2f0 [8];
  string e_3;
  undefined1 local_2c8 [8];
  string e_2;
  undefined1 local_2a0 [8];
  string e_1;
  undefined1 local_278 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_240;
  CURL *local_220;
  CURL *curl;
  unsigned_long file_size;
  allocator local_1e9;
  undefined1 local_1e8 [8];
  string errStr;
  FILE *fin;
  string local_1b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  allocator local_189;
  string local_188;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  allocator local_159;
  string local_158;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined4 local_130;
  allocator local_129;
  string local_128;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  byte local_f1;
  undefined1 local_f0 [7];
  bool showProgress;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string url;
  string filename;
  const_iterator i;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"UPLOAD must be called with at least three arguments.",&local_41)
    ;
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
    goto LAB_0057c8a0;
  }
  filename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(local_20);
  this_00 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(&filename.field_2._M_allocated_capacity + 1);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this_00);
  pbVar4 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this_00);
  std::__cxx11::string::string((string *)(url.field_2._M_local_buf + 8),(string *)pbVar4);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this_00);
  pbVar4 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this_00);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar4);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&filename.field_2 + 8));
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  local_f1 = 0;
  while( true ) {
    local_100._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_20);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8),&local_100);
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
    bVar2 = std::operator==(pbVar4,"TIMEOUT");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      local_108._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_20);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8),&local_108);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_128,"UPLOAD missing time for TIMEOUT.",&local_129);
        cmCommand::SetError(&this->super_cmCommand,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
        this_local._7_1_ = 0;
        local_130 = 1;
        goto LAB_0057c842;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar5);
    }
    else {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8));
      bVar2 = std::operator==(pbVar4,"INACTIVITY_TIMEOUT");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        local_138._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_20);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8),&local_138);
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_158,"UPLOAD missing time for INACTIVITY_TIMEOUT.",&local_159);
          cmCommand::SetError(&this->super_cmCommand,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          this_local._7_1_ = 0;
          local_130 = 1;
          goto LAB_0057c842;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar5);
      }
      else {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
        bVar2 = std::operator==(pbVar4,"LOG");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8));
          local_168._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_20);
          bVar2 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8),&local_168);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_188,"UPLOAD missing VAR for LOG.",&local_189);
            cmCommand::SetError(&this->super_cmCommand,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator((allocator<char> *)&local_189);
            this_local._7_1_ = 0;
            local_130 = 1;
            goto LAB_0057c842;
          }
          pbVar4 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar4);
        }
        else {
          pbVar4 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          bVar2 = std::operator==(pbVar4,"STATUS");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
            local_198._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(local_20);
            bVar2 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8),&local_198);
            if (bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_1b8,"UPLOAD missing VAR for STATUS.",
                         (allocator *)((long)&fin + 7));
              cmCommand::SetError(&this->super_cmCommand,&local_1b8);
              std::__cxx11::string::~string((string *)&local_1b8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&fin + 7));
              this_local._7_1_ = 0;
              local_130 = 1;
              goto LAB_0057c842;
            }
            pbVar4 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar4);
          }
          else {
            pbVar4 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            bVar2 = std::operator==(pbVar4,"SHOW_PROGRESS");
            if (bVar2) {
              local_f1 = 1;
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&filename.field_2 + 8));
  }
  errStr.field_2._8_8_ = cmsys::SystemTools::Fopen((string *)((long)&url.field_2 + 8),"rb");
  if ((FILE *)errStr.field_2._8_8_ == (FILE *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1e8,"UPLOAD cannot open file \'",&local_1e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_size,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&url.field_2 + 8),"\' for reading.");
    std::__cxx11::string::operator+=((string *)local_1e8,(string *)&file_size);
    std::__cxx11::string::~string((string *)&file_size);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1e8);
    this_local._7_1_ = 0;
    local_130 = 1;
    std::__cxx11::string::~string((string *)local_1e8);
  }
  else {
    curl = (CURL *)cmsys::SystemTools::FileLength((string *)((long)&url.field_2 + 8));
    curl_global_init(3);
    local_220 = curl_easy_init();
    if (local_220 == (CURL *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_240,"UPLOAD error initializing curl.",
                 (allocator *)((long)&g_curl.Easy + 7));
      cmCommand::SetError(&this->super_cmCommand,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
      fclose((FILE *)errStr.field_2._8_8_);
      this_local._7_1_ = 0;
      local_130 = 1;
    }
    else {
      anon_unknown.dwarf_24109b::cURLEasyGuard::cURLEasyGuard
                ((cURLEasyGuard *)&stack0xfffffffffffffdb0,local_220);
      e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_FAILONERROR,1);
      if (e.field_2._12_4_ == CURLE_OK) {
        e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_UPLOAD,1);
        curl_00 = local_220;
        if (e.field_2._12_4_ == CURLE_OK) {
          uVar6 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(curl_00,CURLOPT_URL,uVar6);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ =
                 curl_easy_setopt(local_220,CURLOPT_WRITEFUNCTION,
                                  anon_unknown.dwarf_24109b::cmWriteToMemoryCallback);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ =
                   curl_easy_setopt(local_220,CURLOPT_DEBUGFUNCTION,
                                    anon_unknown.dwarf_24109b::cmFileCommandCurlDebugCallback);
              if (e.field_2._12_4_ == CURLE_OK) {
                this_01 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10;
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)this_01);
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)((long)&e_5.field_2 + 8));
                e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_WRITEDATA,this_01);
                if (e.field_2._12_4_ == CURLE_OK) {
                  e.field_2._12_4_ =
                       curl_easy_setopt(local_220,CURLOPT_DEBUGDATA,
                                        (undefined1 *)((long)&e_5.field_2 + 8));
                  if (e.field_2._12_4_ == CURLE_OK) {
                    e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_FOLLOWLOCATION,1);
                    if (e.field_2._12_4_ == CURLE_OK) {
                      uVar7 = std::__cxx11::string::empty();
                      if ((uVar7 & 1) == 0) {
                        e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_VERBOSE,1);
                        if (e.field_2._12_4_ != CURLE_OK) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_3e8,"UPLOAD cannot set verbose: ",
                                     (allocator *)(e_9.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_3e8,pcVar5);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                          this_local._7_1_ = 0;
                          local_130 = 1;
                          std::__cxx11::string::~string((string *)local_3e8);
                          goto LAB_0057c7f2;
                        }
                        e.field_2._12_4_ = 0;
                      }
                      if (0 < inactivity_timeout) {
                        e.field_2._12_4_ =
                             curl_easy_setopt(local_220,CURLOPT_TIMEOUT,inactivity_timeout);
                        if (e.field_2._12_4_ != CURLE_OK) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_410,"UPLOAD cannot set timeout: ",
                                     (allocator *)(helper.Text.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(helper.Text.field_2._M_local_buf + 0xf));
                          pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_410,pcVar5);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_410);
                          this_local._7_1_ = 0;
                          local_130 = 1;
                          std::__cxx11::string::~string((string *)local_410);
                          goto LAB_0057c7f2;
                        }
                        e.field_2._12_4_ = 0;
                      }
                      if (0 < (long)logVar.field_2._8_8_) {
                        curl_easy_setopt(local_220,CURLOPT_LOW_SPEED_LIMIT,1);
                        curl_easy_setopt(local_220,CURLOPT_LOW_SPEED_TIME,logVar.field_2._8_8_);
                      }
                      anon_unknown.dwarf_24109b::cURLProgressHelper::cURLProgressHelper
                                ((cURLProgressHelper *)((long)&e_10.field_2 + 8),this,"upload");
                      if ((local_f1 & 1) == 0) {
LAB_0057c285:
                        e.field_2._12_4_ =
                             curl_easy_setopt(local_220,CURLOPT_READDATA,errStr.field_2._8_8_);
                        if (e.field_2._12_4_ == CURLE_OK) {
                          e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_INFILESIZE,curl);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            e.field_2._12_4_ = curl_easy_perform(local_220);
                            anon_unknown.dwarf_24109b::cURLEasyGuard::release
                                      ((cURLEasyGuard *)&stack0xfffffffffffffdb0);
                            curl_easy_cleanup(local_220);
                            uVar7 = std::__cxx11::string::empty();
                            if ((uVar7 & 1) == 0) {
                              std::__cxx11::ostringstream::ostringstream(local_688);
                              poVar8 = (ostream *)
                                       std::ostream::operator<<(local_688,e.field_2._12_4_);
                              poVar8 = std::operator<<(poVar8,";\"");
                              pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                              poVar8 = std::operator<<(poVar8,pcVar5);
                              std::operator<<(poVar8,"\"");
                              pcVar1 = (this->super_cmCommand).Makefile;
                              std::__cxx11::ostringstream::str();
                              pcVar5 = (char *)std::__cxx11::string::c_str();
                              cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar5);
                              std::__cxx11::string::~string
                                        ((string *)(log.field_2._M_local_buf + 8));
                              std::__cxx11::ostringstream::~ostringstream(local_688);
                            }
                            curl_global_cleanup();
                            fclose((FILE *)errStr.field_2._8_8_);
                            errStr.field_2._8_8_ = 0;
                            uVar7 = std::__cxx11::string::empty();
                            if ((uVar7 & 1) == 0) {
                              std::__cxx11::string::string(local_6c8);
                              bVar2 = std::vector<char,_std::allocator<char>_>::empty
                                                ((vector<char,_std::allocator<char>_> *)
                                                 &chunkDebug.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                              if (!bVar2) {
                                local_6c9 = '\0';
                                std::vector<char,_std::allocator<char>_>::push_back
                                          ((vector<char,_std::allocator<char>_> *)
                                           &chunkDebug.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            field_0x10,&local_6c9);
                                std::__cxx11::string::operator+=(local_6c8,"Response:\n");
                                local_6d8._M_current =
                                     (char *)std::vector<char,_std::allocator<char>_>::begin
                                                       ((vector<char,_std::allocator<char>_> *)
                                                        &chunkDebug.
                                                                                                                  
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                                pcVar9 = __gnu_cxx::
                                         __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                         ::operator*(&local_6d8);
                                std::__cxx11::string::operator+=(local_6c8,pcVar9);
                                std::__cxx11::string::operator+=(local_6c8,"\n");
                              }
                              bVar2 = std::vector<char,_std::allocator<char>_>::empty
                                                ((vector<char,_std::allocator<char>_> *)
                                                 ((long)&e_5.field_2 + 8));
                              if (!bVar2) {
                                local_6d9 = '\0';
                                std::vector<char,_std::allocator<char>_>::push_back
                                          ((vector<char,_std::allocator<char>_> *)
                                           ((long)&e_5.field_2 + 8),&local_6d9);
                                std::__cxx11::string::operator+=(local_6c8,"Debug:\n");
                                local_6e8._M_current =
                                     (char *)std::vector<char,_std::allocator<char>_>::begin
                                                       ((vector<char,_std::allocator<char>_> *)
                                                        ((long)&e_5.field_2 + 8));
                                pcVar9 = __gnu_cxx::
                                         __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                         ::operator*(&local_6e8);
                                std::__cxx11::string::operator+=(local_6c8,pcVar9);
                                std::__cxx11::string::operator+=(local_6c8,"\n");
                              }
                              pcVar1 = (this->super_cmCommand).Makefile;
                              pcVar5 = (char *)std::__cxx11::string::c_str();
                              cmMakefile::AddDefinition
                                        (pcVar1,(string *)((long)&statusVar.field_2 + 8),pcVar5);
                              std::__cxx11::string::~string(local_6c8);
                            }
                            this_local._7_1_ = 1;
                            local_130 = 1;
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_508,"UPLOAD cannot set input file size: ",
                                       &local_509);
                            std::allocator<char>::~allocator((allocator<char> *)&local_509);
                            pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_508,pcVar5);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_508);
                            this_local._7_1_ = 0;
                            local_130 = 1;
                            std::__cxx11::string::~string((string *)local_508);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_4e0,"UPLOAD cannot set input file: ",
                                     (allocator *)(e_14.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                          pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_4e0,pcVar5);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_4e0);
                          this_local._7_1_ = 0;
                          local_130 = 1;
                          std::__cxx11::string::~string((string *)local_4e0);
                        }
                      }
                      else {
                        e.field_2._12_4_ = curl_easy_setopt(local_220,CURLOPT_NOPROGRESS,0);
                        if (e.field_2._12_4_ == CURLE_OK) {
                          e.field_2._12_4_ =
                               curl_easy_setopt(local_220,CURLOPT_PROGRESSFUNCTION,
                                                anon_unknown.dwarf_24109b::
                                                cmFileUploadProgressCallback);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            e.field_2._12_4_ =
                                 curl_easy_setopt(local_220,CURLOPT_PROGRESSDATA,
                                                  (undefined1 *)((long)&e_10.field_2 + 8));
                            if (e.field_2._12_4_ == CURLE_OK) {
                              e.field_2._12_4_ = 0;
                              goto LAB_0057c285;
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_4b8,"UPLOAD cannot set progress data: ",
                                       (allocator *)(e_13.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_13.field_2._M_local_buf + 0xf));
                            pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_4b8,pcVar5);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_4b8);
                            this_local._7_1_ = 0;
                            local_130 = 1;
                            std::__cxx11::string::~string((string *)local_4b8);
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_490,"UPLOAD cannot set progress function: ",
                                       (allocator *)(e_12.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_12.field_2._M_local_buf + 0xf));
                            pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_490,pcVar5);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_490);
                            this_local._7_1_ = 0;
                            local_130 = 1;
                            std::__cxx11::string::~string((string *)local_490);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_468,"UPLOAD cannot set noprogress value: ",
                                     (allocator *)(e_11.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                          pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_468,pcVar5);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_468);
                          this_local._7_1_ = 0;
                          local_130 = 1;
                          std::__cxx11::string::~string((string *)local_468);
                        }
                      }
                      anon_unknown.dwarf_24109b::cURLProgressHelper::~cURLProgressHelper
                                ((cURLProgressHelper *)((long)&e_10.field_2 + 8));
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)local_3c0,"UPLOAD cannot set follow-redirect option: ",
                                 (allocator *)(e_8.field_2._M_local_buf + 0xf));
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                      pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                      std::__cxx11::string::operator+=((string *)local_3c0,pcVar5);
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_3c0);
                      this_local._7_1_ = 0;
                      local_130 = 1;
                      std::__cxx11::string::~string((string *)local_3c0);
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_398,"UPLOAD cannot set debug data: ",
                               (allocator *)(e_7.field_2._M_local_buf + 0xf));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(e_7.field_2._M_local_buf + 0xf));
                    pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_398,pcVar5);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_398);
                    this_local._7_1_ = 0;
                    local_130 = 1;
                    std::__cxx11::string::~string((string *)local_398);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_370,"UPLOAD cannot set write data: ",
                             (allocator *)(e_6.field_2._M_local_buf + 0xf));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                  pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                  std::__cxx11::string::operator+=((string *)local_370,pcVar5);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_370);
                  this_local._7_1_ = 0;
                  local_130 = 1;
                  std::__cxx11::string::~string((string *)local_370);
                }
LAB_0057c7f2:
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)((long)&e_5.field_2 + 8));
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)
                           &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)local_318,"UPLOAD cannot set debug function: ",
                           (allocator *)
                           &chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x17);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           &chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x17);
                pcVar5 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=((string *)local_318,pcVar5);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_318);
                this_local._7_1_ = 0;
                local_130 = 1;
                std::__cxx11::string::~string((string *)local_318);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_2f0,"UPLOAD cannot set write function: ",
                         (allocator *)(e_4.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              pcVar5 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_2f0,pcVar5);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_2f0);
              this_local._7_1_ = 0;
              local_130 = 1;
              std::__cxx11::string::~string((string *)local_2f0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_2c8,"UPLOAD cannot set url: ",
                       (allocator *)(e_3.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            pcVar5 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_2c8,pcVar5);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_2c8);
            this_local._7_1_ = 0;
            local_130 = 1;
            std::__cxx11::string::~string((string *)local_2c8);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_2a0,"UPLOAD cannot set upload flag: ",
                     (allocator *)(e_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          pcVar5 = curl_easy_strerror(e.field_2._12_4_);
          std::__cxx11::string::operator+=((string *)local_2a0,pcVar5);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_2a0);
          this_local._7_1_ = 0;
          local_130 = 1;
          std::__cxx11::string::~string((string *)local_2a0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_278,"UPLOAD cannot set fail on error flag: ",
                   (allocator *)(e_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        pcVar5 = curl_easy_strerror(e.field_2._12_4_);
        std::__cxx11::string::operator+=((string *)local_278,pcVar5);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_278);
        this_local._7_1_ = 0;
        local_130 = 1;
        std::__cxx11::string::~string((string *)local_278);
      }
      anon_unknown.dwarf_24109b::cURLEasyGuard::~cURLEasyGuard
                ((cURLEasyGuard *)&stack0xfffffffffffffdb0);
    }
  }
LAB_0057c842:
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
LAB_0057c8a0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if(args.size() < 3)
    {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }

    ++i;
    }

  // Open file for reading:
  //
  FILE *fin = cmsys::SystemTools::Fopen(filename, "rb");
  if(!fin)
    {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
    }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
    }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "UPLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
    }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res = ::curl_easy_setopt(curl,
    CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  fclose(fin);
  fin = NULL;

  if(!logVar.empty())
    {
    std::string log;

    if(!chunkResponse.empty())
      {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += &*chunkResponse.begin();
      log += "\n";
      }

    if(!chunkDebug.empty())
      {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += &*chunkDebug.begin();
      log += "\n";
      }

    this->Makefile->AddDefinition(logVar, log.c_str());
    }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}